

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *__return_storage_ptr__,string *expr)

{
  size_type sVar1;
  string tok;
  string local_40;
  
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (__return_storage_ptr__);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  sVar1 = expr->_M_string_length;
  do {
    if ((expr->_M_dataplus)._M_p[sVar1 - 1] == ' ') {
      if (local_40._M_string_length != 0) {
        rpn_parse_str_reverse(&local_40);
        rpn_map_multichar_op(&local_40);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&__return_storage_ptr__->c,&local_40);
        local_40._M_string_length = 0;
        *local_40._M_dataplus._M_p = '\0';
      }
    }
    else {
      std::__cxx11::string::push_back((char)&local_40);
    }
    sVar1 = sVar1 - 1;
  } while (sVar1 != 0);
  if (local_40._M_string_length != 0) {
    rpn_parse_str_reverse(&local_40);
    rpn_map_multichar_op(&local_40);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->c,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::stack<std::string> rpn_parse(std::string expr)
{
	std::stack<std::string> stack;
	std::string tok;

	std::size_t i = expr.length() - 1;
	do
	{
		if (expr[i] != ' ')
		{
			tok += expr[i];
		}
		else if (!tok.empty())
		{
			rpn_parse_str_reverse(tok);
			rpn_map_multichar_op(tok);
			stack.push(tok);
			tok.clear();
		}
	} while (i-- != 0);

	if (!tok.empty())
	{
		rpn_parse_str_reverse(tok);
		rpn_map_multichar_op(tok);
		stack.push(tok);
	}

	return stack;
}